

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O1

int sgemv_(char *trans,integer *m,integer *n,real *alpha,real *a,integer *lda,real *x,integer *incx,
          real *beta,real *y,integer *incy)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  integer iVar6;
  logical lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint *puVar12;
  long lVar13;
  ulong uVar14;
  float *pfVar15;
  real *prVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  
  uVar9 = (ulong)*lda;
  sgemv_::info = 0;
  lVar7 = lsame_(trans,"N");
  if (((lVar7 == 0) && (lVar7 = lsame_(trans,"T"), lVar7 == 0)) &&
     (lVar7 = lsame_(trans,"C"), lVar7 == 0)) {
    iVar6 = 1;
  }
  else {
    iVar2 = *m;
    if (iVar2 < 0) {
      iVar6 = 2;
    }
    else if (*n < 0) {
      iVar6 = 3;
    }
    else {
      iVar11 = 1;
      if (1 < iVar2) {
        iVar11 = iVar2;
      }
      iVar6 = 6;
      if (iVar11 <= *lda) {
        if (*incx == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = sgemv_::info;
          if (*incy == 0) {
            iVar6 = 0xb;
          }
        }
      }
    }
  }
  sgemv_::info = iVar6;
  if (sgemv_::info == 0) {
    if (((*m != 0) && (*n != 0)) &&
       (((*alpha != 0.0 || ((NAN(*alpha) || (*beta != 1.0)))) || (NAN(*beta))))) {
      lVar7 = lsame_(trans,"N");
      puVar12 = (uint *)m;
      piVar5 = n;
      if (lVar7 == 0) {
        puVar12 = (uint *)n;
        piVar5 = m;
      }
      uVar8 = *puVar12;
      uVar10 = (ulong)uVar8;
      iVar2 = 1 - (*piVar5 + -1) * *incx;
      if (0 < *incx) {
        iVar2 = 1;
      }
      iVar11 = *incy;
      lVar13 = (long)iVar11;
      iVar17 = 1 - (uVar8 - 1) * iVar11;
      if (0 < lVar13) {
        iVar17 = 1;
      }
      fVar20 = *beta;
      if ((fVar20 != 1.0) || (NAN(fVar20))) {
        if (iVar11 == 1) {
          if ((fVar20 != 0.0) || (NAN(fVar20))) {
            if (0 < (int)uVar8) {
              uVar14 = 0;
              do {
                y[uVar14] = *beta * y[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar10 != uVar14);
            }
          }
          else if (0 < (int)uVar8) {
            memset(y,0,uVar10 * 4);
          }
        }
        else if ((fVar20 != 0.0) || (NAN(fVar20))) {
          sgemv_::iy = iVar17;
          if (0 < (int)uVar8) {
            uVar14 = (ulong)iVar17;
            pfVar15 = y + (uVar14 - 1);
            do {
              *pfVar15 = *beta * *pfVar15;
              pfVar15 = pfVar15 + lVar13;
              sgemv_::iy = (int)uVar14 + iVar11;
              uVar14 = (ulong)(uint)sgemv_::iy;
              uVar8 = (int)uVar10 - 1;
              uVar10 = (ulong)uVar8;
            } while (uVar8 != 0);
          }
        }
        else {
          sgemv_::iy = iVar17;
          if (0 < (int)uVar8) {
            uVar14 = (ulong)iVar17;
            prVar16 = y + (uVar14 - 1);
            do {
              *prVar16 = 0.0;
              prVar16 = prVar16 + lVar13;
              sgemv_::iy = (int)uVar14 + iVar11;
              uVar14 = (ulong)(uint)sgemv_::iy;
              uVar8 = (int)uVar10 - 1;
              uVar10 = (ulong)uVar8;
            } while (uVar8 != 0);
          }
        }
      }
      if ((*alpha != 0.0) || (NAN(*alpha))) {
        uVar10 = ~uVar9;
        lVar7 = lsame_(trans,"N");
        if (lVar7 == 0) {
          iVar11 = *incx;
          uVar8 = *n;
          sgemv_::jy = iVar17;
          if ((long)iVar11 == 1) {
            if (0 < (int)uVar8) {
              lVar13 = (long)iVar17;
              iVar2 = *m;
              iVar11 = *incy;
              prVar16 = a + uVar9 + uVar10 + 1;
              lVar18 = 1;
              do {
                fVar20 = 0.0;
                if (0 < iVar2) {
                  lVar19 = 0;
                  do {
                    fVar20 = fVar20 + prVar16[lVar19] * x[lVar19];
                    lVar19 = lVar19 + 1;
                  } while ((ulong)(iVar2 + 1) - 1 != lVar19);
                }
                y[lVar13 + -1] = fVar20 * *alpha + y[lVar13 + -1];
                lVar13 = lVar13 + iVar11;
                lVar18 = lVar18 + 1;
                prVar16 = prVar16 + uVar9;
              } while (lVar18 != (ulong)uVar8 + 1);
              sgemv_::jy = (integer)lVar13;
            }
          }
          else if (0 < (int)uVar8) {
            lVar13 = (long)iVar17;
            iVar17 = *m;
            iVar4 = *incy;
            prVar16 = a + uVar9 + uVar10;
            lVar18 = 1;
            do {
              fVar20 = 0.0;
              if (0 < iVar17) {
                uVar10 = 1;
                pfVar15 = x + (long)iVar2 + -1;
                do {
                  fVar20 = fVar20 + prVar16[uVar10] * *pfVar15;
                  uVar10 = uVar10 + 1;
                  pfVar15 = pfVar15 + iVar11;
                } while (iVar17 + 1 != uVar10);
              }
              y[lVar13 + -1] = fVar20 * *alpha + y[lVar13 + -1];
              lVar13 = lVar13 + iVar4;
              lVar18 = lVar18 + 1;
              prVar16 = prVar16 + uVar9;
            } while (lVar18 != (ulong)uVar8 + 1);
            sgemv_::jy = (integer)lVar13;
          }
        }
        else {
          iVar11 = *incy;
          uVar8 = *n;
          sgemv_::jx = iVar2;
          if ((long)iVar11 == 1) {
            if (0 < (int)uVar8) {
              lVar13 = (long)iVar2;
              iVar2 = *incx;
              prVar16 = a + uVar9 + uVar10 + 1;
              lVar18 = 1;
              do {
                fVar20 = x[lVar13 + -1];
                if (((fVar20 != 0.0) || (NAN(fVar20))) && (uVar3 = *m, 0 < (int)uVar3)) {
                  fVar1 = *alpha;
                  uVar10 = 0;
                  do {
                    y[uVar10] = prVar16[uVar10] * fVar20 * fVar1 + y[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar3 != uVar10);
                }
                lVar13 = lVar13 + iVar2;
                lVar18 = lVar18 + 1;
                prVar16 = prVar16 + uVar9;
              } while (lVar18 != (ulong)uVar8 + 1);
              sgemv_::jx = (integer)lVar13;
            }
          }
          else if (0 < (int)uVar8) {
            lVar13 = (long)iVar2;
            iVar2 = *incx;
            prVar16 = a + uVar9 + uVar10;
            lVar18 = 1;
            do {
              fVar20 = x[lVar13 + -1];
              if ((fVar20 != 0.0) || (NAN(fVar20))) {
                fVar1 = *alpha;
                uVar3 = *m;
                sgemv_::iy = iVar17;
                if (0 < (int)uVar3) {
                  lVar19 = 1;
                  pfVar15 = y + (long)iVar17 + -1;
                  do {
                    *pfVar15 = prVar16[lVar19] * fVar20 * fVar1 + *pfVar15;
                    lVar19 = lVar19 + 1;
                    pfVar15 = pfVar15 + iVar11;
                    sgemv_::iy = sgemv_::iy + iVar11;
                  } while ((ulong)uVar3 + 1 != lVar19);
                }
              }
              lVar13 = lVar13 + iVar2;
              lVar18 = lVar18 + 1;
              prVar16 = prVar16 + uVar9;
            } while (lVar18 != (ulong)uVar8 + 1);
            sgemv_::jx = (integer)lVar13;
          }
        }
      }
    }
  }
  else {
    xerbla_("SGEMV ",&sgemv_::info);
  }
  return 0;
}

Assistant:

int sgemv_(char *trans, integer *m, integer *n, real *alpha,
	real *a, integer *lda, real *x, integer *incx, real *beta, real *y,
	integer *incy)
{
    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2;

    /* Local variables */
    static integer i__, j, ix, iy, jx, jy, kx, ky, info;
    static real temp;
    static integer lenx, leny;
    extern logical lsame_(char *, char *);
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SGEMV  performs one of the matrix-vector operations

       y := alpha*A*x + beta*y,   or   y := alpha*A'*x + beta*y,

    where alpha and beta are scalars, x and y are vectors and A is an
    m by n matrix.

    Parameters
    ==========

    TRANS  - CHARACTER*1.
             On entry, TRANS specifies the operation to be performed as
             follows:

                TRANS = 'N' or 'n'   y := alpha*A*x + beta*y.

                TRANS = 'T' or 't'   y := alpha*A'*x + beta*y.

                TRANS = 'C' or 'c'   y := alpha*A'*x + beta*y.

             Unchanged on exit.

    M      - INTEGER.
             On entry, M specifies the number of rows of the matrix A.
             M must be at least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of the matrix A.
             N must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, n ).
             Before entry, the leading m by n part of the array A must
             contain the matrix of coefficients.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program. LDA must be at least
             max( 1, m ).
             Unchanged on exit.

    X      - REAL             array of DIMENSION at least
             ( 1 + ( n - 1 )*abs( INCX ) ) when TRANS = 'N' or 'n'
             and at least
             ( 1 + ( m - 1 )*abs( INCX ) ) otherwise.
             Before entry, the incremented array X must contain the
             vector x.
             Unchanged on exit.

    INCX   - INTEGER.
             On entry, INCX specifies the increment for the elements of
             X. INCX must not be zero.
             Unchanged on exit.

    BETA   - REAL            .
             On entry, BETA specifies the scalar beta. When BETA is
             supplied as zero then Y need not be set on input.
             Unchanged on exit.

    Y      - REAL             array of DIMENSION at least
             ( 1 + ( m - 1 )*abs( INCY ) ) when TRANS = 'N' or 'n'
             and at least
             ( 1 + ( n - 1 )*abs( INCY ) ) otherwise.
             Before entry with BETA non-zero, the incremented array Y
             must contain the vector y. On exit, Y is overwritten by the
             updated vector y.

    INCY   - INTEGER.
             On entry, INCY specifies the increment for the elements of
             Y. INCY must not be zero.
             Unchanged on exit.


    Level 2 Blas routine.

    -- Written on 22-October-1986.
       Jack Dongarra, Argonne National Lab.
       Jeremy Du Croz, Nag Central Office.
       Sven Hammarling, Nag Central Office.
       Richard Hanson, Sandia National Labs.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    --x;
    --y;

    /* Function Body */
    info = 0;
    if (! lsame_(trans, "N") && ! lsame_(trans, "T") && ! lsame_(trans, "C")
	    ) {
	info = 1;
    } else if (*m < 0) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*lda < max(1,*m)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    } else if (*incy == 0) {
	info = 11;
    }
    if (info != 0) {
	xerbla_("SGEMV ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (*alpha == 0.f && *beta == 1.f)) {
	return 0;
    }

/*
       Set  LENX  and  LENY, the lengths of the vectors x and y, and set
       up the start points in  X  and  Y.
*/

    if (lsame_(trans, "N")) {
	lenx = *n;
	leny = *m;
    } else {
	lenx = *m;
	leny = *n;
    }
    if (*incx > 0) {
	kx = 1;
    } else {
	kx = 1 - (lenx - 1) * *incx;
    }
    if (*incy > 0) {
	ky = 1;
    } else {
	ky = 1 - (leny - 1) * *incy;
    }

/*
       Start the operations. In this version the elements of A are
       accessed sequentially with one pass through A.

       First form  y := beta*y.
*/

    if (*beta != 1.f) {
	if (*incy == 1) {
	    if (*beta == 0.f) {
		i__1 = leny;
		for (i__ = 1; i__ <= i__1; ++i__) {
		    y[i__] = 0.f;
/* L10: */
		}
	    } else {
		i__1 = leny;
		for (i__ = 1; i__ <= i__1; ++i__) {
		    y[i__] = *beta * y[i__];
/* L20: */
		}
	    }
	} else {
	    iy = ky;
	    if (*beta == 0.f) {
		i__1 = leny;
		for (i__ = 1; i__ <= i__1; ++i__) {
		    y[iy] = 0.f;
		    iy += *incy;
/* L30: */
		}
	    } else {
		i__1 = leny;
		for (i__ = 1; i__ <= i__1; ++i__) {
		    y[iy] = *beta * y[iy];
		    iy += *incy;
/* L40: */
		}
	    }
	}
    }
    if (*alpha == 0.f) {
	return 0;
    }
    if (lsame_(trans, "N")) {

/*        Form  y := alpha*A*x + y. */

	jx = kx;
	if (*incy == 1) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (x[jx] != 0.f) {
		    temp = *alpha * x[jx];
		    i__2 = *m;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			y[i__] += temp * a[i__ + j * a_dim1];
/* L50: */
		    }
		}
		jx += *incx;
/* L60: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (x[jx] != 0.f) {
		    temp = *alpha * x[jx];
		    iy = ky;
		    i__2 = *m;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			y[iy] += temp * a[i__ + j * a_dim1];
			iy += *incy;
/* L70: */
		    }
		}
		jx += *incx;
/* L80: */
	    }
	}
    } else {

/*        Form  y := alpha*A'*x + y. */

	jy = ky;
	if (*incx == 1) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		temp = 0.f;
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp += a[i__ + j * a_dim1] * x[i__];
/* L90: */
		}
		y[jy] += *alpha * temp;
		jy += *incy;
/* L100: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		temp = 0.f;
		ix = kx;
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp += a[i__ + j * a_dim1] * x[ix];
		    ix += *incx;
/* L110: */
		}
		y[jy] += *alpha * temp;
		jy += *incy;
/* L120: */
	    }
	}
    }

    return 0;

/*     End of SGEMV . */

}